

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O3

void notify_children(__cilkrts_worker *w,uint msg)

{
  int iVar1;
  __cilkrts_worker *p_Var2;
  signal_node_t *psVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = w->g->P + -1;
  iVar1 = w->self;
  iVar5 = iVar1 * 2 + 1;
  if (iVar4 <= iVar5) {
    return;
  }
  p_Var2 = w->g->workers[iVar5];
  if (p_Var2 == (__cilkrts_worker *)0x0) {
    do {
    } while( true );
  }
  psVar3 = p_Var2->l->signal_node;
  if (psVar3 == (signal_node_t *)0x0) {
    notify_children_cold_2();
  }
  else {
    signal_node_msg(psVar3,msg);
    iVar5 = iVar1 * 2 + 2;
    if (iVar4 <= iVar5) {
      return;
    }
    p_Var2 = w->g->workers[iVar5];
    if (p_Var2 == (__cilkrts_worker *)0x0) {
      do {
      } while( true );
    }
    psVar3 = p_Var2->l->signal_node;
    if (psVar3 != (signal_node_t *)0x0) {
      signal_node_msg(psVar3,msg);
      return;
    }
  }
  notify_children_cold_1();
}

Assistant:

static void notify_children(__cilkrts_worker *w, unsigned int msg)
{
    int child_num;
    __cilkrts_worker *child;
    int num_sys_workers = w->g->P - 1;

    // If worker is "n", then its children are 2n + 1, and 2n + 2.
    child_num = (w->self << 1) + 1;
    if (child_num < num_sys_workers) {
        do {
            child = w->g->workers[child_num];
        } while (child == NULL); /* at the begining, busy waiting until the worker is initialized */
        CILK_ASSERT(child->l->signal_node);
        signal_node_msg(child->l->signal_node, msg);
        child_num++;
        if (child_num < num_sys_workers) {
            do {
                child = w->g->workers[child_num];
            } while (child == NULL); /* at the begining, busy waiting until the worker is initialized */
            CILK_ASSERT(child->l->signal_node);
            signal_node_msg(child->l->signal_node, msg);
        }
    }
}